

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_contextual_item_image_text
                  (nk_context *ctx,nk_image img,char *text,int len,nk_flags align)

{
  nk_vec2 item_padding;
  nk_rect bounds_00;
  nk_image img_00;
  nk_button_behavior behavior;
  nk_bool nVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 unaff_RBX;
  float in_ESI;
  nk_flags *in_RDI;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  nk_style_button *in_stack_00000008;
  nk_user_font *in_stack_00000010;
  nk_input *in_stack_00000018;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff58;
  nk_rect *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  nk_flags *local_70;
  nk_flags in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  nk_command_buffer *out;
  undefined4 local_38;
  undefined4 uVar2;
  nk_bool local_14;
  
  if (((in_RDI == (nk_flags *)0x0) || (*(long *)(in_RDI + 0x1036) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x1036) + 0xa8) == 0)) {
    local_14 = 0;
  }
  else {
    local_38 = (undefined4)*(undefined8 *)(in_RDI + 0x1036);
    uVar2 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x1036) >> 0x20);
    out = (nk_command_buffer *)(in_RDI + 0x5a);
    item_padding.y = in_stack_ffffffffffffff70;
    item_padding.x = in_stack_ffffffffffffff6c;
    behavior = nk_widget_fitting(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,item_padding);
    if (behavior == NK_BUTTON_DEFAULT) {
      local_14 = 0;
    }
    else {
      if ((behavior == 2) ||
         (local_70 = in_RDI,
         (*(uint *)(*(long *)(CONCAT44(uVar2,local_38) + 0xa8) + 4) & 0x1000) != 0)) {
        local_70 = (nk_flags *)0x0;
      }
      bounds_00.y = (float)in_ECX;
      bounds_00.x = (float)uVar2;
      bounds_00.w = (float)in_EDX;
      bounds_00.h = in_ESI;
      img_00.w = (short)unaff_R14;
      img_00.h = (short)((ulong)unaff_R14 >> 0x10);
      img_00.region[0] = (short)((ulong)unaff_R14 >> 0x20);
      img_00.region[1] = (short)((ulong)unaff_R14 >> 0x30);
      img_00.handle = (nk_handle)unaff_RBX;
      img_00._16_8_ = unaff_retaddr;
      nVar1 = nk_do_button_text_image
                        (local_70,out,bounds_00,img_00,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,behavior,
                         in_stack_00000008,in_stack_00000010,in_stack_00000018);
      if (nVar1 == 0) {
        local_14 = 0;
      }
      else {
        nk_contextual_close((nk_context *)0x12f80e);
        local_14 = 1;
      }
    }
  }
  return local_14;
}

Assistant:

NK_API nk_bool
nk_contextual_item_image_text(struct nk_context *ctx, struct nk_image img,
const char *text, int len, nk_flags align)
{
struct nk_window *win;
const struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
state = nk_widget_fitting(&bounds, ctx, style->contextual_button.padding);
if (!state) return nk_false;

in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text_image(&ctx->last_widget_state, &win->buffer, bounds,
img, text, len, align, NK_BUTTON_DEFAULT, &style->contextual_button, style->font, in)){
nk_contextual_close(ctx);
return nk_true;
}
return nk_false;
}